

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

Class * __thiscall cppgenerate::Class::operator=(Class *this,Class *other)

{
  pointer pMVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer this_00;
  pointer pMVar5;
  
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->m_namespace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->m_systemIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->m_systemIncludes)._M_t,&(other->m_systemIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->m_localIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->m_localIncludes)._M_t,&(other->m_localIncludes)._M_t);
    pMVar1 = (this->m_methods).
             super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar2 = (this->m_methods).
             super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = pMVar1;
    if (pMVar2 != pMVar1) {
      do {
        Method::~Method(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pMVar2);
      (this->m_methods).
      super__Vector_base<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar1;
    }
    std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::operator=
              (&this->m_methods,&other->m_methods);
    pMVar3 = (this->m_memberVariables).
             super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = (this->m_memberVariables).
             super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar5 = pMVar3;
    if (pMVar4 != pMVar3) {
      do {
        (**(pMVar5->super_Variable)._vptr_Variable)(pMVar5);
        pMVar5 = pMVar5 + 1;
      } while (pMVar5 != pMVar4);
      (this->m_memberVariables).
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_finish = pMVar3;
    }
    std::__cxx11::string::_M_assign((string *)&this->m_documentation);
    this->m_isQobject = other->m_isQobject;
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::
    _M_erase_at_end(&this->m_constructors,
                    (this->m_constructors).
                    super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::operator=
              (&this->m_constructors,&other->m_constructors);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::
    _M_erase_at_end(&this->m_parents,
                    (this->m_parents).
                    super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::operator=
              (&this->m_parents,&other->m_parents);
  }
  return this;
}

Assistant:

Class& Class::operator=( const Class& other ){
    if( this != &other ){
        m_className = other.m_className;
        m_namespace = other.m_namespace;
        m_systemIncludes.clear();
        m_systemIncludes = other.m_systemIncludes;
        m_localIncludes.clear();
        m_localIncludes = other.m_localIncludes;
        m_methods.clear();
        m_methods = other.m_methods;
        m_memberVariables.clear();
        m_documentation = other.m_documentation;
        m_isQobject = other.m_isQobject;
        m_constructors.clear();
        m_constructors = other.m_constructors;
        m_parents.clear();
        m_parents = other.m_parents;
    }

    return *this;
}